

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

void Curl_ssl_free_certinfo(Curl_easy *data)

{
  curl_certinfo *pcVar1;
  int local_1c;
  int i;
  curl_certinfo *ci;
  Curl_easy *data_local;
  
  pcVar1 = &(data->info).certs;
  if (pcVar1->num_of_certs != 0) {
    for (local_1c = 0; local_1c < pcVar1->num_of_certs; local_1c = local_1c + 1) {
      curl_slist_free_all((data->info).certs.certinfo[local_1c]);
      (data->info).certs.certinfo[local_1c] = (curl_slist *)0x0;
    }
    (*Curl_cfree)((data->info).certs.certinfo);
    (data->info).certs.certinfo = (curl_slist **)0x0;
    pcVar1->num_of_certs = 0;
  }
  return;
}

Assistant:

void Curl_ssl_free_certinfo(struct Curl_easy *data)
{
  struct curl_certinfo *ci = &data->info.certs;

  if(ci->num_of_certs) {
    /* free all individual lists used */
    int i;
    for(i = 0; i<ci->num_of_certs; i++) {
      curl_slist_free_all(ci->certinfo[i]);
      ci->certinfo[i] = NULL;
    }

    free(ci->certinfo); /* free the actual array too */
    ci->certinfo = NULL;
    ci->num_of_certs = 0;
  }
}